

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_add_settings
              (nghttp2_session *session,uint8_t flags,nghttp2_settings_entry *iv,size_t niv)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  nghttp2_outbound_item *item_00;
  nghttp2_settings_entry *pnVar4;
  nghttp2_session *in_RCX;
  nghttp2_settings_entry *in_RDX;
  byte in_SIL;
  nghttp2_session *in_RDI;
  uint8_t no_rfc7540_pri;
  nghttp2_inflight_settings *inflight_settings;
  nghttp2_mem *mem;
  int rv;
  size_t i;
  nghttp2_settings_entry *iv_copy;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  undefined7 in_stack_ffffffffffffff98;
  nghttp2_mem *mem_00;
  nghttp2_mem *mem_01;
  uint8_t flags_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  nghttp2_session *pnVar5;
  nghttp2_session *pnVar6;
  int local_4;
  
  mem_00 = (nghttp2_mem *)0x0;
  bVar1 = in_RDI->pending_no_rfc7540_priorities;
  mem_01 = &in_RDI->mem;
  if ((in_SIL & 1) != 0) {
    if (in_RCX != (nghttp2_session *)0x0) {
      return -0x1f5;
    }
    if (in_RDI->max_outbound_ack <= in_RDI->obq_flood_counter_) {
      return -0x388;
    }
  }
  iVar2 = nghttp2_iv_check(in_RDX,(size_t)in_RCX);
  if (iVar2 == 0) {
    local_4 = -0x1f5;
  }
  else {
    for (pnVar5 = (nghttp2_session *)0x0; pnVar5 < in_RCX;
        pnVar5 = (nghttp2_session *)((long)&(pnVar5->streams).table + 1)) {
      if (in_RDX[(long)pnVar5].settings_id == 9) {
        if (bVar1 == 0xff) {
          bVar1 = (byte)in_RDX[(long)pnVar5].value;
        }
        else if (in_RDX[(long)pnVar5].value != (uint)bVar1) {
          return -0x1f5;
        }
      }
    }
    item_00 = (nghttp2_outbound_item *)
              nghttp2_mem_malloc(mem_00,CONCAT17(bVar1,in_stack_ffffffffffffff98));
    if (item_00 == (nghttp2_outbound_item *)0x0) {
      local_4 = -0x385;
    }
    else if ((in_RCX == (nghttp2_session *)0x0) ||
            (pnVar4 = nghttp2_frame_iv_copy
                                ((nghttp2_settings_entry *)pnVar5,
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 mem_01), pnVar4 != (nghttp2_settings_entry *)0x0)) {
      if ((in_SIL & 1) == 0) {
        iVar2 = inflight_settings_new
                          ((nghttp2_inflight_settings **)mem_01,(nghttp2_settings_entry *)mem_00,
                           CONCAT17(bVar1,in_stack_ffffffffffffff98),(nghttp2_mem *)0x112f8e);
        if (iVar2 != 0) {
          iVar3 = nghttp2_is_fatal(iVar2);
          if (iVar3 != 0) {
            nghttp2_mem_free(mem_00,(void *)CONCAT17(bVar1,in_stack_ffffffffffffff98));
            nghttp2_mem_free(mem_00,(void *)CONCAT17(bVar1,in_stack_ffffffffffffff98));
            return iVar2;
          }
          __assert_fail("nghttp2_is_fatal(rv)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                        ,0x1dc0,
                        "int nghttp2_session_add_settings(nghttp2_session *, uint8_t, const nghttp2_settings_entry *, size_t)"
                       );
        }
        in_stack_ffffffffffffffb4 = 0;
      }
      flags_00 = (uint8_t)((ulong)mem_01 >> 0x38);
      nghttp2_outbound_item_init((nghttp2_outbound_item *)0x112fff);
      nghttp2_frame_settings_init
                ((nghttp2_settings *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 flags_00,(nghttp2_settings_entry *)mem_00,CONCAT17(bVar1,in_stack_ffffffffffffff98)
                );
      local_4 = nghttp2_session_add_item(in_RCX,item_00);
      if (local_4 == 0) {
        if ((in_SIL & 1) == 0) {
          session_append_inflight_settings(in_RDI,(nghttp2_inflight_settings *)mem_00);
          pnVar5 = in_RCX;
        }
        else {
          in_RDI->obq_flood_counter_ = in_RDI->obq_flood_counter_ + 1;
          pnVar5 = in_RCX;
        }
        for (; pnVar6 = pnVar5, in_RCX != (nghttp2_session *)0x0;
            in_RCX = (nghttp2_session *)&in_RCX[-1].field_0xb97) {
          if (in_RDX[(long)&in_RCX[-1].field_0xb97].settings_id == 3) {
            in_RDI->pending_local_max_concurrent_stream =
                 in_RDX[(long)&in_RCX[-1].field_0xb97].value;
            break;
          }
        }
        do {
          if (pnVar6 == (nghttp2_session *)0x0) goto LAB_00113196;
          if (in_RDX[(long)&pnVar6[-1].field_0xb97].settings_id == 2) {
            in_RDI->pending_enable_push = (uint8_t)in_RDX[(long)&pnVar6[-1].field_0xb97].value;
            goto LAB_00113196;
          }
          pnVar6 = (nghttp2_session *)&pnVar6[-1].field_0xb97;
        } while( true );
      }
      iVar2 = nghttp2_is_fatal(local_4);
      if (iVar2 == 0) {
        __assert_fail("nghttp2_is_fatal(rv)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                      ,0x1dcf,
                      "int nghttp2_session_add_settings(nghttp2_session *, uint8_t, const nghttp2_settings_entry *, size_t)"
                     );
      }
      inflight_settings_del
                ((nghttp2_inflight_settings *)mem_00,
                 (nghttp2_mem *)CONCAT17(bVar1,in_stack_ffffffffffffff98));
      nghttp2_frame_settings_free
                ((nghttp2_settings *)mem_00,(nghttp2_mem *)CONCAT17(bVar1,in_stack_ffffffffffffff98)
                );
      nghttp2_mem_free(mem_00,(void *)CONCAT17(bVar1,in_stack_ffffffffffffff98));
    }
    else {
      nghttp2_mem_free(mem_00,(void *)CONCAT17(bVar1,in_stack_ffffffffffffff98));
      local_4 = -0x385;
    }
  }
  return local_4;
LAB_00113196:
  if (pnVar5 == (nghttp2_session *)0x0) {
LAB_001131e5:
    if (bVar1 == 0xff) {
      in_RDI->pending_no_rfc7540_priorities = '\0';
    }
    else {
      in_RDI->pending_no_rfc7540_priorities = bVar1;
    }
    return 0;
  }
  if (in_RDX[(long)&pnVar5[-1].field_0xb97].settings_id == 8) {
    in_RDI->pending_enable_connect_protocol = (uint8_t)in_RDX[(long)&pnVar5[-1].field_0xb97].value;
    goto LAB_001131e5;
  }
  pnVar5 = (nghttp2_session *)&pnVar5[-1].field_0xb97;
  goto LAB_00113196;
}

Assistant:

int nghttp2_session_add_settings(nghttp2_session *session, uint8_t flags,
                                 const nghttp2_settings_entry *iv, size_t niv) {
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_settings_entry *iv_copy;
  size_t i;
  int rv;
  nghttp2_mem *mem;
  nghttp2_inflight_settings *inflight_settings = NULL;
  uint8_t no_rfc7540_pri = session->pending_no_rfc7540_priorities;

  mem = &session->mem;

  if (flags & NGHTTP2_FLAG_ACK) {
    if (niv != 0) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    if (session->obq_flood_counter_ >= session->max_outbound_ack) {
      return NGHTTP2_ERR_FLOODED;
    }
  }

  if (!nghttp2_iv_check(iv, niv)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  for (i = 0; i < niv; ++i) {
    if (iv[i].settings_id != NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES) {
      continue;
    }

    if (no_rfc7540_pri == UINT8_MAX) {
      no_rfc7540_pri = (uint8_t)iv[i].value;
      continue;
    }

    if (iv[i].value != (uint32_t)no_rfc7540_pri) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  if (niv > 0) {
    iv_copy = nghttp2_frame_iv_copy(iv, niv, mem);
    if (iv_copy == NULL) {
      nghttp2_mem_free(mem, item);
      return NGHTTP2_ERR_NOMEM;
    }
  } else {
    iv_copy = NULL;
  }

  if ((flags & NGHTTP2_FLAG_ACK) == 0) {
    rv = inflight_settings_new(&inflight_settings, iv, niv, mem);
    if (rv != 0) {
      assert(nghttp2_is_fatal(rv));
      nghttp2_mem_free(mem, iv_copy);
      nghttp2_mem_free(mem, item);
      return rv;
    }
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_settings_init(&frame->settings, flags, iv_copy, niv);
  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    /* The only expected error is fatal one */
    assert(nghttp2_is_fatal(rv));

    inflight_settings_del(inflight_settings, mem);

    nghttp2_frame_settings_free(&frame->settings, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  if (flags & NGHTTP2_FLAG_ACK) {
    ++session->obq_flood_counter_;
  } else {
    session_append_inflight_settings(session, inflight_settings);
  }

  /* Extract NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS and ENABLE_PUSH
     here.  We use it to refuse the incoming stream and PUSH_PROMISE
     with RST_STREAM. */

  for (i = niv; i > 0; --i) {
    if (iv[i - 1].settings_id == NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS) {
      session->pending_local_max_concurrent_stream = iv[i - 1].value;
      break;
    }
  }

  for (i = niv; i > 0; --i) {
    if (iv[i - 1].settings_id == NGHTTP2_SETTINGS_ENABLE_PUSH) {
      session->pending_enable_push = (uint8_t)iv[i - 1].value;
      break;
    }
  }

  for (i = niv; i > 0; --i) {
    if (iv[i - 1].settings_id == NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL) {
      session->pending_enable_connect_protocol = (uint8_t)iv[i - 1].value;
      break;
    }
  }

  if (no_rfc7540_pri == UINT8_MAX) {
    session->pending_no_rfc7540_priorities = 0;
  } else {
    session->pending_no_rfc7540_priorities = no_rfc7540_pri;
  }

  return 0;
}